

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O2

void set_min_size_cb(Fl_Button *param_1,void *v)

{
  Fl_Type *pFVar1;
  bool bVar2;
  Fl_Widget_Type *pFVar3;
  int iVar4;
  Fl_Type **ppFVar5;
  
  if ((char *)v != "LOAD") {
    bVar2 = false;
    ppFVar5 = &Fl_Type::first;
    while (pFVar1 = *ppFVar5, pFVar1 != (Fl_Type *)0x0) {
      if (pFVar1->selected != '\0') {
        iVar4 = (*pFVar1->_vptr_Fl_Type[0x21])(pFVar1);
        if (iVar4 != 0) {
          iVar4 = current_widget->o->h_;
          pFVar3 = current_widget;
          pFVar3[1].super_Fl_Type.level = current_widget->o->w_;
          *(int *)&pFVar3[1].super_Fl_Type.field_0x4c = iVar4;
          bVar2 = true;
        }
      }
      ppFVar5 = &pFVar1->next;
    }
    propagate_load(&the_panel->super_Fl_Group,"LOAD");
    if (bVar2) {
      set_modflag(1);
      return;
    }
  }
  return;
}

Assistant:

void set_min_size_cb(Fl_Button*, void* v) {
  if (v == LOAD) {
  } else {
    int mod = 0;
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_window()) {
        Fl_Window_Type *win = (Fl_Window_Type*)current_widget;
        win->sr_min_w = win->o->w();
        win->sr_min_h = win->o->h();
        mod = 1;
      }
    }
    propagate_load(the_panel, LOAD);
    if (mod) set_modflag(1);
  }
}